

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recenter.h
# Opt level: O0

uint16_t recenter_nonneg(uint16_t r,uint16_t v)

{
  uint16_t v_local;
  uint16_t r_local;
  undefined2 local_2;
  
  local_2 = v;
  if ((uint)v <= (uint)r * 2) {
    if (v < r) {
      local_2 = (r - v) * 2 - 1;
    }
    else {
      local_2 = (v - r) * 2;
    }
  }
  return local_2;
}

Assistant:

static inline uint16_t recenter_nonneg(uint16_t r, uint16_t v) {
  if (v > (r << 1))
    return v;
  else if (v >= r)
    return ((v - r) << 1);
  else
    return ((r - v) << 1) - 1;
}